

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtestTest.cpp
# Opt level: O0

void __thiscall
TEST_UtestShellPointerArrayTest_ShuffleListTestWithRandomAlwaysReturningOne_TestShell::
~TEST_UtestShellPointerArrayTest_ShuffleListTestWithRandomAlwaysReturningOne_TestShell
          (TEST_UtestShellPointerArrayTest_ShuffleListTestWithRandomAlwaysReturningOne_TestShell
           *this)

{
  TEST_UtestShellPointerArrayTest_ShuffleListTestWithRandomAlwaysReturningOne_TestShell *this_local;
  
  ~TEST_UtestShellPointerArrayTest_ShuffleListTestWithRandomAlwaysReturningOne_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(UtestShellPointerArrayTest, ShuffleListTestWithRandomAlwaysReturningOne)
{
    UT_PTR_SET(PlatformSpecificRand, getOne);

    UtestShellPointerArray tests(test0);
    tests.shuffle(3);
    CHECK(tests.get(0) == test0);
    CHECK(tests.get(1) == test2);
    CHECK(tests.get(2) == test1);
}